

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void anon_unknown.dwarf_8df1c::CheckNamespaceConflict
               (ExpressionContext *ctx,SynBase *source,NamespaceData *ns)

{
  uint nameHash;
  TypeBase *pTVar1;
  IdentifierLookupResult *pIVar2;
  IdentifierLookupResult *lookup;
  NamespaceData *ns_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  pTVar1 = LookupTypeByName(ctx,ns->fullNameHash);
  if (pTVar1 != (TypeBase *)0x0) {
    Report(ctx,source,"ERROR: name \'%.*s\' is already taken for a type",
           (ulong)(uint)((int)(ns->name).name.end - (int)(ns->name).name.begin),
           (ns->name).name.begin);
  }
  nameHash = InplaceStr::hash(&(ns->name).name);
  pIVar2 = LookupObjectByName(ctx,nameHash);
  if (pIVar2 != (IdentifierLookupResult *)0x0) {
    if ((pIVar2->variable != (VariableData *)0x0) && (pIVar2->variable->scope == ctx->scope)) {
      Report(ctx,source,"ERROR: name \'%.*s\' is already taken for a variable in current scope",
             (ulong)(uint)((int)(ns->name).name.end - (int)(ns->name).name.begin),
             (ns->name).name.begin);
    }
    if ((pIVar2->function != (FunctionData *)0x0) && (pIVar2->function->scope == ctx->scope)) {
      Report(ctx,source,"ERROR: name \'%.*s\' is already taken for a function",
             (ulong)(uint)((int)(ns->name).name.end - (int)(ns->name).name.begin),
             (ns->name).name.begin);
    }
  }
  return;
}

Assistant:

void CheckNamespaceConflict(ExpressionContext &ctx, SynBase *source, NamespaceData *ns)
	{
		if(LookupTypeByName(ctx, ns->fullNameHash))
			Report(ctx, source, "ERROR: name '%.*s' is already taken for a type", FMT_ISTR(ns->name.name));

		if(IdentifierLookupResult *lookup = LookupObjectByName(ctx, ns->name.name.hash()))
		{
			if(lookup->variable && lookup->variable->scope == ctx.scope)
				Report(ctx, source, "ERROR: name '%.*s' is already taken for a variable in current scope", FMT_ISTR(ns->name.name));

			if(lookup->function && lookup->function->scope == ctx.scope)
				Report(ctx, source, "ERROR: name '%.*s' is already taken for a function", FMT_ISTR(ns->name.name));
		}
	}